

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void UtttHashTest(void)

{
  pointer plVar1;
  mapped_type *this;
  ostream *poVar2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  pointer plVar5;
  int local_13c;
  vector<long,_std::allocator<long>_> moves;
  unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
  hashes;
  IBoard b2;
  long m;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set1;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set2;
  IBoard board;
  
  uttt::IBoard::IBoard(&board);
  set1._M_h._M_buckets = &set1._M_h._M_single_bucket;
  set1._M_h._M_bucket_count = 1;
  set1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set1._M_h._M_element_count = 0;
  set1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set1._M_h._M_rehash_policy._M_next_resize = 0;
  set1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  set2._M_h._M_buckets = &set2._M_h._M_single_bucket;
  set2._M_h._M_bucket_count = 1;
  set2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set2._M_h._M_element_count = 0;
  set2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set2._M_h._M_rehash_policy._M_next_resize = 0;
  set2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Insert_base<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&set1,&board);
  local_13c = 0;
  while (local_13c != 2) {
    std::
    _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&set2._M_h);
    p_Var3 = &set1._M_h._M_before_begin;
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) break;
      hashes._M_h._M_before_begin._M_nxt = p_Var3[3]._M_nxt;
      hashes._M_h._M_buckets = *(__buckets_ptr *)(p_Var3 + 1);
      hashes._M_h._M_bucket_count =
           *(size_type *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
      uttt::IBoard::GetPossibleMoves(&moves,(IBoard *)&hashes);
      plVar1 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      for (plVar5 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start; plVar5 != plVar1; plVar5 = plVar5 + 1) {
        m = *plVar5;
        b2._16_8_ = hashes._M_h._M_before_begin._M_nxt;
        b2._0_8_ = hashes._M_h._M_buckets;
        b2.micro._M_elems[2] = (undefined2)hashes._M_h._M_bucket_count;
        b2.micro._M_elems[3] = hashes._M_h._M_bucket_count._2_2_;
        b2.micro._M_elems[4] = hashes._M_h._M_bucket_count._4_2_;
        b2.micro._M_elems[5] = hashes._M_h._M_bucket_count._6_2_;
        uttt::IBoard::ApplyMove(&b2,&m);
        std::__detail::
        _Insert_base<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&set2._M_h,&b2);
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&moves.super__Vector_base<long,_std::allocator<long>_>);
    }
    std::
    _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(&set1._M_h,&set2._M_h);
    hashes._M_h._M_buckets = &hashes._M_h._M_single_bucket;
    hashes._M_h._M_bucket_count = 1;
    hashes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    hashes._M_h._M_element_count = 0;
    hashes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    hashes._M_h._M_rehash_policy._M_next_resize = 0;
    hashes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Var3 = &set1._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(p_Var3 + 3);
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = *(pointer *)(p_Var3 + 1);
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
      b2._0_8_ = uttt::IBoard::Hash((IBoard *)&moves);
      this = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&hashes,(key_type *)&b2);
      std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::push_back(this,(IBoard *)&moves);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"After iteration ");
    local_13c = local_13c + 1;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_13c);
    poVar2 = std::operator<<(poVar2," set size = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"hashes size = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
    p_Var4 = &hashes._M_h._M_before_begin;
    while( true ) {
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (__node_base *)0x0) break;
      std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>::
      pair((pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_> *)
           &moves,(pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                   *)(p_Var4 + 1));
      poVar2 = std::operator<<((ostream *)&std::cout,"Hash family: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
      plVar1 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
      for (plVar5 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish; plVar5 != plVar1; plVar5 = plVar5 + 3) {
        b2._16_8_ = plVar5[2];
        b2._0_8_ = *plVar5;
        b2.micro._M_elems._4_8_ = plVar5[1];
        uttt::IBoard::Print(&b2);
      }
      std::_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~_Vector_base
                ((_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                 &moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&hashes._M_h);
  }
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&set2._M_h);
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&set1._M_h);
  return;
}

Assistant:

void
UtttHashTest()
{
    uttt::IBoard board;
    std::unordered_set<uttt::IBoard> set1, set2;
    set1.insert(board);
    for (int i = 0; i < 2; ++i)
    {
        set2.clear();
        for (auto b : set1)
        {
            auto moves = b.GetPossibleMoves();
            for (auto m : moves)
            {
                auto b2 = b;
                b2.ApplyMove(m);
                set2.insert(b2);
            }
        }
        set1 = set2;
        std::unordered_map<std::size_t, std::vector<uttt::IBoard>> hashes;
        for (auto b : set1)
            hashes[b.Hash()].push_back(b);
        std::cout << "After iteration " << i + 1 << " set size = " << set1.size() << '\n';
        std::cout << "hashes size = " << hashes.size() << '\n';

        for (auto it : hashes)
        {
            std::cout << "Hash family: " << it.first << '\n';
            for (auto b : it.second)
                b.Print();
        }
    }
}